

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

FrameIndex __thiscall iDynTree::Model::getFrameIndex(Model *this,string *frameName)

{
  FrameIndex FVar1;
  __type _Var2;
  ulong uVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  char *local_1d0 [4];
  stringstream ss;
  ostream local_1a0 [376];
  
  lVar6 = 0;
  for (uVar7 = 0;
      uVar3 = ((long)(this->links).
                     super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->links).
                    super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x70, uVar7 < uVar3; uVar7 = uVar7 + 1) {
    _Var2 = std::operator==(frameName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this->linkNames).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar6));
    if (_Var2) {
      return uVar7;
    }
    lVar6 = lVar6 + 0x20;
  }
  lVar6 = uVar3 << 5;
  while( true ) {
    sVar4 = getNrOfFrames(this);
    if (sVar4 <= uVar3) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_1a0,"Frame named ");
      poVar5 = std::operator<<(poVar5,(string *)frameName);
      std::operator<<(poVar5," not found in the model.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("Model","getFrameIndex",local_1d0[0]);
      std::__cxx11::string::~string((string *)local_1d0);
      FVar1 = FRAME_INVALID_INDEX;
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return FVar1;
    }
    _Var2 = std::operator==(frameName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(this->frameNames).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [((long)(this->links).
                                            super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->links).
                                           super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                           ._M_impl.super__Vector_impl_data._M_start) / -0x70].
                                    _M_dataplus._M_p + lVar6));
    if (_Var2) break;
    uVar3 = uVar3 + 1;
    lVar6 = lVar6 + 0x20;
  }
  return uVar3;
}

Assistant:

FrameIndex Model::getFrameIndex(const std::string& frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return (FrameIndex)i;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return (FrameIndex)i;
        }
    }

    std::stringstream ss;
    ss << "Frame named " << frameName << " not found in the model.";
    reportError("Model","getFrameIndex",ss.str().c_str());
    return FRAME_INVALID_INDEX;
}